

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O1

int __thiscall
icu_63::PluralRules::clone
          (PluralRules *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  PluralRules *this_00;
  
  this_00 = (PluralRules *)UMemory::operator_new((UMemory *)0x18,(size_t)__fn);
  if (this_00 == (PluralRules *)0x0) {
    this_00 = (PluralRules *)0x0;
  }
  else {
    PluralRules(this_00,this);
  }
  if (this_00 != (PluralRules *)0x0) {
    if (this_00->mInternalStatus < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_002b9088;
    (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
  }
  this_00 = (PluralRules *)0x0;
LAB_002b9088:
  return (int)this_00;
}

Assistant:

PluralRules*
PluralRules::clone() const {
    PluralRules* newObj = new PluralRules(*this);
    // Since clone doesn't have a 'status' parameter, the best we can do is return nullptr if
    // the newly created object was not fully constructed properly (an error occurred).
    if (newObj != nullptr && U_FAILURE(newObj->mInternalStatus)) {
        delete newObj;
        newObj = nullptr;
    }
    return newObj;
}